

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O0

shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
 __thiscall
peg::ParserGenerator::perform_core
          (ParserGenerator *this,char *s,size_t n,Rules *rules,string *start,
          bool *enablePackratParsing,Log *log)

{
  __node_base_ptr *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  undefined *puVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  undefined8 __args;
  bool bVar2;
  bool bVar3;
  mapped_type *pmVar4;
  mapped_type *this_02;
  reference pvVar5;
  type *ptVar6;
  ulong uVar7;
  char *pcVar8;
  pointer *pppVar9;
  size_t *this_03;
  reference ppVar10;
  type *ptVar11;
  iterator __first;
  iterator __last;
  reference __in;
  type *__k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_2;
  size_type sVar12;
  type *ptVar13;
  type *ptVar14;
  size_type sVar15;
  reference ppVar16;
  element_type *ope_00;
  reference __in_00;
  type *__k_00;
  type *this_04;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pair<unsigned_long,_unsigned_long> pVar17;
  shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
  sVar18;
  function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_00000010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c88;
  function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_c68;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
  local_c48;
  BinOpeInfo *local_c18;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
  *info;
  Instruction *instruction;
  const_iterator __end3_5;
  const_iterator __begin3_5;
  type *__range3_5;
  mapped_type *rule_9;
  type *instructions;
  type *name_6;
  _Self local_bd0;
  iterator __end2_5;
  iterator __begin2_5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<peg::ParserGenerator::Instruction,_std::allocator<peg::ParserGenerator::Instruction>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<peg::ParserGenerator::Instruction,_std::allocator<peg::ParserGenerator::Instruction>_>_>_>_>
  *__range2_5;
  allocator<char> local_ba1;
  key_type local_ba0;
  undefined1 local_b80 [8];
  mapped_type *rule_8;
  key_type local_b70;
  undefined1 local_b50 [16];
  shared_ptr<peg::Ope> local_b40;
  allocator<char> local_b29;
  key_type local_b28;
  mapped_type *local_b08;
  mapped_type *rule_6;
  undefined1 local_af0 [8];
  shared_ptr<peg::Ope> ope;
  Definition *rule_7;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>
  *x_1;
  iterator __end3_4;
  iterator __begin3_4;
  element_type *__range3_4;
  key_type local_ab0;
  allocator<char> local_a89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a48;
  element_type *local_a28;
  pair<unsigned_long,_unsigned_long> line_8;
  DetectLeftRecursion vis_2;
  type *rule_5;
  type *name_5;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_true>
  local_990;
  iterator __end2_4;
  iterator __begin2_4;
  element_type *__range2_4;
  LinkReferences vis_1;
  Definition *rule_4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>
  *x;
  iterator __end2_3;
  iterator __begin2_3;
  element_type *__range2_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_930;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_910;
  undefined1 local_8f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> msg;
  pair<unsigned_long,_unsigned_long> line_7;
  type *rule_3;
  type *name_4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_true>
  local_8a8;
  iterator __end2_2;
  iterator __begin2_2;
  element_type *__range2_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  unsigned_long local_868;
  pair<unsigned_long,_unsigned_long> line_6;
  type *ptr_3;
  type *name_3;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_840;
  iterator __end3_3;
  iterator __begin3_3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  *__range3_3;
  undefined1 local_818 [8];
  ReferenceChecker vis;
  type *rule_2;
  type *_;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_true>
  local_740;
  iterator __end2_1;
  iterator __begin2_1;
  element_type *__range2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  string local_6f8 [32];
  string local_6d8 [32];
  string local_6b8 [32];
  iterator local_698;
  size_type local_690;
  undefined1 local_688 [8];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  referenced;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  unsigned_long local_5e8;
  pair<unsigned_long,_unsigned_long> line_5;
  mapped_type *start_rule;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  unsigned_long local_568;
  pair<unsigned_long,_unsigned_long> line_4;
  type *ptr_2;
  type *name_2;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
  local_540;
  iterator __end3_2;
  iterator __begin3_2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  *__range3_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  unsigned_long local_4c0;
  pair<unsigned_long,_unsigned_long> line_3;
  type *ptr_1;
  type *type;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
  local_498;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  *__range3_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  unsigned_long local_418;
  pair<unsigned_long,_unsigned_long> line_2;
  type *ptr;
  type *name_1;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
  local_3f0;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  *__range3;
  bool ret;
  mapped_type *rule_1;
  undefined1 local_3c0 [7];
  bool ignore;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  type *user_rule;
  type *user_name;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>_>,_true>
  local_360;
  const_iterator __end2;
  const_iterator __begin2;
  Rules *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  unsigned_long local_320;
  pair<unsigned_long,_unsigned_long> line_1;
  pair<unsigned_long,_unsigned_long> line;
  allocator<char> local_2d9;
  key_type local_2d8;
  undefined1 local_2b8 [8];
  Result r;
  undefined1 local_228 [8];
  any dt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  iterator local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_1d8;
  undefined8 local_1c8;
  allocator<char> local_1b1;
  string local_1b0;
  shared_ptr<peg::Ope> local_190 [2];
  allocator<char> local_169;
  key_type local_168;
  mapped_type *local_148;
  mapped_type *rule;
  element_type *grammar;
  Data data;
  string *start_local;
  Rules *rules_local;
  size_t n_local;
  char *s_local;
  ParserGenerator *this_local;
  
  data._248_8_ = enablePackratParsing;
  Data::Data((Data *)&grammar);
  pmVar4 = (mapped_type *)
           std::
           __shared_ptr_access<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&grammar);
  puVar1 = RECOVER_DEFINITION_NAME;
  rule = pmVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,puVar1,&local_169);
  this_02 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
            ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
                          *)pmVar4,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  pmVar4 = rule;
  local_148 = this_02;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"x",&local_1b1);
  local_1d8._M_allocated_capacity = 0;
  local_1d8._8_8_ = 0;
  local_1c8 = 0;
  std::vector<std::shared_ptr<peg::Ope>,_std::allocator<std::shared_ptr<peg::Ope>_>_>::vector
            ((vector<std::shared_ptr<peg::Ope>,_std::allocator<std::shared_ptr<peg::Ope>_>_> *)
             &local_1d8);
  ref((peg *)local_190,(Grammar *)pmVar4,&local_1b0,"",false,
      (vector<std::shared_ptr<peg::Ope>,_std::allocator<std::shared_ptr<peg::Ope>_>_> *)&local_1d8);
  Definition::operator<=(this_02,local_190);
  std::shared_ptr<peg::Ope>::~shared_ptr(local_190);
  std::vector<std::shared_ptr<peg::Ope>,_std::allocator<std::shared_ptr<peg::Ope>_>_>::~vector
            ((vector<std::shared_ptr<peg::Ope>,_std::allocator<std::shared_ptr<peg::Ope>_>_> *)
             &local_1d8);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::__cxx11::string::operator=((string *)local_148,RECOVER_DEFINITION_NAME);
  local_148->s_ = "[native]";
  local_148->ignoreSemanticValue = true;
  local_148->is_macro = true;
  dt._M_storage._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"x",(allocator<char> *)((long)&dt._M_storage + 7));
  dt._M_storage._6_1_ = 0;
  local_1e8 = &local_208;
  local_1e0 = 1;
  __l_00._M_len = 1;
  __l_00._M_array = local_1e8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&local_148->params,__l_00);
  local_d10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e8;
  do {
    local_d10 = local_d10 + -1;
    std::__cxx11::string::~string((string *)local_d10);
  } while (local_d10 != &local_208);
  std::allocator<char>::~allocator((allocator<char> *)((long)&dt._M_storage + 7));
  r.error_info._112_8_ = &grammar;
  std::any::
  any<peg::ParserGenerator::Data*,peg::ParserGenerator::Data*,std::any::_Manager_internal<peg::ParserGenerator::Data*>,void>
            ((any *)local_228,(Data **)&r.error_info.keep_previous_token);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"Grammar",&local_2d9);
  pmVar4 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
                         *)s,&local_2d8);
  std::
  function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&line.second,in_stack_00000010);
  Definition::parse((Result *)local_2b8,pmVar4,(char *)n,(size_t)rules,(any *)local_228,(char *)0x0,
                    (Log *)&line.second);
  std::
  function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)&line.second);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  if ((local_2b8[0] & 1U) == 0) {
    bVar2 = std::function::operator_cast_to_bool((function *)in_stack_00000010);
    if (bVar2) {
      if (r.error_info.expected_tokens.
          super__Vector_base<std::pair<const_char_*,_const_peg::Definition_*>,_std::allocator<std::pair<const_char_*,_const_peg::Definition_*>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
        pVar17 = line_info((char *)n,(char *)r.len);
        local_320 = pVar17.first;
        line_1.first = pVar17.second;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_340,"syntax error",(allocator<char> *)((long)&__range2 + 7));
        std::
        function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()(in_stack_00000010,pVar17.first,pVar17.second,&local_340,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&r.error_info.message.field_2 + 8));
        std::__cxx11::string::~string((string *)&local_340);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
      }
      else {
        pVar17 = line_info((char *)n,
                           (char *)r.error_info.expected_tokens.
                                   super__Vector_base<std::pair<const_char_*,_const_peg::Definition_*>,_std::allocator<std::pair<const_char_*,_const_peg::Definition_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        line.first = pVar17.second;
        line_1.second = pVar17.first;
        std::
        function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()(in_stack_00000010,line_1.second,line.first,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &r.error_info.message_pos,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&r.error_info.message.field_2 + 8));
      }
    }
    std::
    shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
    ::shared_ptr((shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
                  *)this,(nullptr_t)0x0);
    __range2._0_4_ = 1;
    goto LAB_00127b80;
  }
  __end2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>_>_>_>
           ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>_>_>_>
                    *)start);
  local_360._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>_>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>_>_>_>
              *)start);
  while (bVar2 = std::__detail::operator!=
                           (&__end2.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>_>,_true>
                            ,&local_360), bVar2) {
    pvVar5 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>_>,_false,_true>
             ::operator*(&__end2);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>_>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>_>
            *)&user_name,pvVar5);
    ptVar6 = std::get<0ul,std::__cxx11::string_const,std::shared_ptr<peg::Ope>>
                       ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>_>
                         *)&user_name);
    name.field_2._8_8_ =
         std::get<1ul,std::__cxx11::string_const,std::shared_ptr<peg::Ope>>
                   ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>_>
                     *)&user_name);
    std::__cxx11::string::string((string *)local_3c0,(string *)ptVar6);
    rule_1._7_1_ = false;
    uVar7 = std::__cxx11::string::empty();
    if (((uVar7 & 1) == 0) &&
       (pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_3c0), *pcVar8 == '~')) {
      rule_1._7_1_ = true;
      std::__cxx11::string::erase((ulong)local_3c0,0);
    }
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      pmVar4 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
                             *)rule,(key_type *)local_3c0);
      Definition::operator<=(pmVar4,(shared_ptr<peg::Ope> *)name.field_2._8_8_);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)local_3c0);
      pmVar4->ignoreSemanticValue = rule_1._7_1_;
    }
    std::__cxx11::string::~string((string *)local_3c0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>_>
             *)&user_name);
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>_>,_false,_true>
    ::operator++(&__end2);
  }
  bVar2 = true;
  bVar3 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
          ::empty((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                   *)&data.start_pos);
  if (!bVar3) {
    __end3 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
             ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                      *)&data.start_pos);
    local_3f0._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
            ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                   *)&data.start_pos);
    while (bVar2 = __gnu_cxx::operator!=(&__end3,&local_3f0), bVar2) {
      ppVar10 = __gnu_cxx::
                __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
                ::operator*(&__end3);
      ptVar11 = std::get<0ul,std::__cxx11::string,char_const*>(ppVar10);
      line_2.second = (unsigned_long)std::get<1ul,std::__cxx11::string,char_const*>(ppVar10);
      bVar2 = std::function::operator_cast_to_bool((function *)in_stack_00000010);
      if (bVar2) {
        pVar17 = line_info((char *)n,*(char **)line_2.second);
        local_418 = pVar17.first;
        line_2.first = pVar17.second;
        std::operator+(&local_458,"The definition \'",ptVar11);
        std::operator+(&local_438,&local_458,"\' is already defined.");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_478,"",(allocator<char> *)((long)&__range3_1 + 7));
        std::
        function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()(in_stack_00000010,pVar17.first,pVar17.second,&local_438,&local_478);
        std::__cxx11::string::~string((string *)&local_478);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range3_1 + 7));
        std::__cxx11::string::~string((string *)&local_438);
        std::__cxx11::string::~string((string *)&local_458);
      }
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
      ::operator++(&__end3);
    }
    bVar2 = false;
  }
  bVar3 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
          ::empty((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                   *)&data.duplicates_of_definition.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar3) {
    pppVar9 = &data.duplicates_of_definition.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end3_1 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
               ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                        *)pppVar9);
    local_498._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
            ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                   *)pppVar9);
    while (bVar2 = __gnu_cxx::operator!=(&__end3_1,&local_498), bVar2) {
      ppVar10 = __gnu_cxx::
                __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
                ::operator*(&__end3_1);
      ptVar11 = std::get<0ul,std::__cxx11::string,char_const*>(ppVar10);
      line_3.second = (unsigned_long)std::get<1ul,std::__cxx11::string,char_const*>(ppVar10);
      bVar2 = std::function::operator_cast_to_bool((function *)in_stack_00000010);
      if (bVar2) {
        pVar17 = line_info((char *)n,*(char **)line_3.second);
        local_4c0 = pVar17.first;
        line_3.first = pVar17.second;
        std::operator+(&local_500,"The instruction \'",ptVar11);
        std::operator+(&local_4e0,&local_500,"\' is already defined.");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_520,"",(allocator<char> *)((long)&__range3_2 + 7));
        std::
        function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()(in_stack_00000010,pVar17.first,pVar17.second,&local_4e0,&local_520);
        std::__cxx11::string::~string((string *)&local_520);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range3_2 + 7));
        std::__cxx11::string::~string((string *)&local_4e0);
        std::__cxx11::string::~string((string *)&local_500);
      }
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
      ::operator++(&__end3_1);
    }
    bVar2 = false;
  }
  bVar3 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
          ::empty((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                   *)&data.instructions._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (!bVar3) {
    this_03 = &data.instructions._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end3_2 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
               ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                        *)this_03);
    local_540._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
            ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                   *)this_03);
    while (bVar2 = __gnu_cxx::operator!=(&__end3_2,&local_540), bVar2) {
      ppVar10 = __gnu_cxx::
                __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
                ::operator*(&__end3_2);
      ptVar11 = std::get<0ul,std::__cxx11::string,char_const*>(ppVar10);
      line_4.second = (unsigned_long)std::get<1ul,std::__cxx11::string,char_const*>(ppVar10);
      bVar2 = std::function::operator_cast_to_bool((function *)in_stack_00000010);
      if (bVar2) {
        pVar17 = line_info((char *)n,*(char **)line_4.second);
        local_568 = pVar17.first;
        line_4.first = pVar17.second;
        std::operator+(&local_5a8,"The back reference \'",ptVar11);
        std::operator+(&local_588,&local_5a8,"\' is undefined.");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5c8,"",(allocator<char> *)((long)&start_rule + 7));
        std::
        function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()(in_stack_00000010,pVar17.first,pVar17.second,&local_588,&local_5c8);
        std::__cxx11::string::~string((string *)&local_5c8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&start_rule + 7));
        std::__cxx11::string::~string((string *)&local_588);
        std::__cxx11::string::~string((string *)&local_5a8);
      }
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
      ::operator++(&__end3_2);
    }
    bVar2 = false;
  }
  line_5.second =
       (unsigned_long)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
       ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
                     *)rule,(key_type *)
                            &data.grammar.
                             super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount);
  if ((((mapped_type *)line_5.second)->ignoreSemanticValue & 1U) != 0) {
    bVar2 = std::function::operator_cast_to_bool((function *)in_stack_00000010);
    if (bVar2) {
      pVar17 = line_info((char *)n,*(char **)(line_5.second + 0x20));
      local_5e8 = pVar17.first;
      line_5.first = pVar17.second;
      std::operator+(&local_628,"Ignore operator cannot be applied to \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     line_5.second);
      std::operator+(&local_608,&local_628,"\'.");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_648,"",
                 (allocator<char> *)((long)&referenced._M_h._M_single_bucket + 7));
      std::
      function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(in_stack_00000010,pVar17.first,pVar17.second,&local_608,&local_648);
      std::__cxx11::string::~string((string *)&local_648);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&referenced._M_h._M_single_bucket + 7));
      std::__cxx11::string::~string((string *)&local_608);
      std::__cxx11::string::~string((string *)&local_628);
    }
    bVar2 = false;
  }
  puVar1 = WHITESPACE_DEFINITION_NAME;
  if (!bVar2) {
    std::
    shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
    ::shared_ptr((shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
                  *)this,(nullptr_t)0x0);
    __range2._0_4_ = 1;
    goto LAB_00127b80;
  }
  __range2_1._4_1_ = 1;
  local_720 = &local_718;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_718,puVar1,(allocator<char> *)((long)&__range2_1 + 7));
  puVar1 = WORD_DEFINITION_NAME;
  local_720 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_6f8,puVar1,(allocator<char> *)((long)&__range2_1 + 6));
  puVar1 = RECOVER_DEFINITION_NAME;
  local_720 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_6d8,puVar1,(allocator<char> *)((long)&__range2_1 + 5));
  local_720 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6b8;
  std::__cxx11::string::string((string *)local_720,(string *)line_5.second);
  __range2_1._4_1_ = 0;
  local_698 = &local_718;
  local_690 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&__range2_1 + 1));
  __l._M_len = local_690;
  __l._M_array = local_698;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_688,__l,0,(hasher *)((long)&__range2_1 + 3),
                  (key_equal *)((long)&__range2_1 + 2),
                  (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)((long)&__range2_1 + 1));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&__range2_1 + 1));
  __args_2 = &local_718;
  local_ec0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_698;
  do {
    local_ec0 = local_ec0 + -1;
    std::__cxx11::string::~string((string *)local_ec0);
  } while (local_ec0 != __args_2);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_1 + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_1 + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_1 + 7));
  pmVar4 = rule;
  __end2_1 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
             ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
                      *)rule);
  local_740._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
              *)pmVar4);
  while (bVar3 = std::__detail::operator!=
                           (&__end2_1.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_true>
                            ,&local_740), pmVar4 = rule, bVar3) {
    ppVar16 = std::__detail::
              _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_false,_true>
              ::operator*(&__end2_1);
    std::get<0ul,std::__cxx11::string_const,peg::Definition>(ppVar16);
    vis.params_ = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)std::get<1ul,std::__cxx11::string_const,peg::Definition>(ppVar16);
    ReferenceChecker::ReferenceChecker
              ((ReferenceChecker *)local_818,(Grammar *)rule,&((type *)vis.params_)->params);
    Definition::accept((Definition *)vis.params_,(int)local_818,__addr,(socklen_t *)__args_2);
    this_00 = &vis.error_message._M_h._M_single_bucket;
    __first = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this_00);
    __last = std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this_00);
    std::
    unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::insert<std::__detail::_Node_iterator<std::__cxx11::string,true,true>>
              ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_688,
               (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                )__first.
                 super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ._M_cur,
               (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                )__last.
                 super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ._M_cur);
    __end3_3 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
               ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                        *)&vis);
    local_840._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                *)&vis);
    while (bVar3 = std::__detail::operator!=
                             (&__end3_3.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
                              ,&local_840), bVar3) {
      __in = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
             ::operator*(&__end3_3);
      __k = std::get<0ul,std::__cxx11::string_const,char_const*>(__in);
      line_6.second = (unsigned_long)std::get<1ul,std::__cxx11::string_const,char_const*>(__in);
      bVar2 = std::function::operator_cast_to_bool((function *)in_stack_00000010);
      if (bVar2) {
        pVar17 = line_info((char *)n,*(char **)line_6.second);
        local_868 = pVar17.first;
        line_6.first = pVar17.second;
        __args_2 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&vis.error_s._M_h._M_single_bucket,__k);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_888,"",(allocator<char> *)((long)&__range2_2 + 7));
        std::
        function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()(in_stack_00000010,pVar17.first,pVar17.second,__args_2,&local_888);
        std::__cxx11::string::~string((string *)&local_888);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_2 + 7));
      }
      bVar2 = false;
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
      ::operator++(&__end3_3);
    }
    ReferenceChecker::~ReferenceChecker((ReferenceChecker *)local_818);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_false,_true>
    ::operator++(&__end2_1);
  }
  __end2_2 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
             ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
                      *)rule);
  local_8a8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
              *)pmVar4);
  while (bVar3 = std::__detail::operator!=
                           (&__end2_2.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_true>
                            ,&local_8a8), pmVar4 = rule, bVar3) {
    ppVar16 = std::__detail::
              _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_false,_true>
              ::operator*(&__end2_2);
    ptVar13 = std::get<0ul,std::__cxx11::string_const,peg::Definition>(ppVar16);
    ptVar14 = std::get<1ul,std::__cxx11::string_const,peg::Definition>(ppVar16);
    sVar12 = std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_688,ptVar13);
    if ((sVar12 == 0) &&
       (bVar3 = std::function::operator_cast_to_bool((function *)in_stack_00000010), bVar3)) {
      pVar17 = line_info((char *)n,ptVar14->s_);
      msg.field_2._8_8_ = pVar17.first;
      std::operator+(&local_910,"\'",ptVar13);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8f0,
                     &local_910,"\' is not referenced.");
      std::__cxx11::string::~string((string *)&local_910);
      __args = msg.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_930,"",(allocator<char> *)((long)&__range2_3 + 7));
      __args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8f0;
      std::
      function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(in_stack_00000010,__args,pVar17.second,__args_2,&local_930);
      std::__cxx11::string::~string((string *)&local_930);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_3 + 7));
      std::__cxx11::string::~string((string *)local_8f0);
    }
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_false,_true>
    ::operator++(&__end2_2);
  }
  if (bVar2) {
    __end2_3 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
               ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
                        *)rule);
    x = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>
         *)std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
                  *)pmVar4);
    while (bVar2 = std::__detail::operator!=
                             (&__end2_3.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_true>
                              ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_true>
                                *)&x), pmVar4 = rule, bVar2) {
      ppVar16 = std::__detail::
                _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_false,_true>
                ::operator*(&__end2_3);
      vis_1.params_ =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&ppVar16->second;
      LinkReferences::LinkReferences
                ((LinkReferences *)&__range2_4,(Grammar *)rule,&(ppVar16->second).params);
      Definition::accept((Definition *)vis_1.params_,(int)&__range2_4,__addr_00,
                         (socklen_t *)__args_2);
      LinkReferences::~LinkReferences((LinkReferences *)&__range2_4);
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_false,_true>
      ::operator++(&__end2_3);
    }
    bVar2 = true;
    __end2_4 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
               ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
                        *)rule);
    local_990._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
                *)pmVar4);
    while (bVar3 = std::__detail::operator!=
                             (&__end2_4.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_true>
                              ,&local_990), bVar3) {
      ppVar16 = std::__detail::
                _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_false,_true>
                ::operator*(&__end2_4);
      ptVar13 = std::get<0ul,std::__cxx11::string_const,peg::Definition>(ppVar16);
      ptVar14 = std::get<1ul,std::__cxx11::string_const,peg::Definition>(ppVar16);
      DetectLeftRecursion::DetectLeftRecursion((DetectLeftRecursion *)&line_8.second,ptVar13);
      Definition::accept(ptVar14,(int)&line_8 + 8,__addr_01,(socklen_t *)__args_2);
      if (vis_2.super_Visitor._vptr_Visitor != (_func_int **)0x0) {
        bVar2 = std::function::operator_cast_to_bool((function *)in_stack_00000010);
        if (bVar2) {
          pVar17 = line_info((char *)n,(char *)vis_2.super_Visitor._vptr_Visitor);
          local_a28 = (element_type *)pVar17.first;
          line_8.first = pVar17.second;
          std::operator+(&local_a68,"\'",ptVar13);
          std::operator+(&local_a48,&local_a68,"\' is left recursive.");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_a88,"",&local_a89);
          __args_2 = &local_a48;
          std::
          function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::operator()(in_stack_00000010,pVar17.first,pVar17.second,__args_2,&local_a88);
          std::__cxx11::string::~string((string *)&local_a88);
          std::allocator<char>::~allocator(&local_a89);
          std::__cxx11::string::~string((string *)&local_a48);
          std::__cxx11::string::~string((string *)&local_a68);
        }
        bVar2 = false;
      }
      DetectLeftRecursion::~DetectLeftRecursion((DetectLeftRecursion *)&line_8.second);
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_false,_true>
      ::operator++(&__end2_4);
    }
    if (bVar2) {
      bVar2 = detect_infiniteLoop((ParserGenerator *)s,(Data *)&grammar,(Definition *)line_5.second,
                                  in_stack_00000010,(char *)n);
      pmVar4 = rule;
      puVar1 = WHITESPACE_DEFINITION_NAME;
      if (bVar2) {
        std::
        shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
        ::shared_ptr((shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
                      *)this,(nullptr_t)0x0);
        __range2._0_4_ = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ab0,puVar1,(allocator<char> *)((long)&__range3_4 + 7));
        sVar15 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
                 ::count((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
                          *)pmVar4,&local_ab0);
        std::__cxx11::string::~string((string *)&local_ab0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range3_4 + 7));
        pmVar4 = rule;
        if (sVar15 != 0) {
          __end3_4 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
                     ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
                              *)rule);
          x_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>
                 *)std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
                   ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
                          *)pmVar4);
          while (bVar2 = std::__detail::operator!=
                                   (&__end3_4.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_true>
                                    ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_true>
                                      *)&x_1), pmVar4 = rule, puVar1 = WHITESPACE_DEFINITION_NAME,
                bVar2) {
            ppVar16 = std::__detail::
                      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_false,_true>
                      ::operator*(&__end3_4);
            ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&ppVar16->second;
            Definition::get_core_operator((Definition *)local_af0);
            ope_00 = std::__shared_ptr_access<peg::Ope,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator*((__shared_ptr_access<peg::Ope,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_af0);
            bVar2 = IsLiteralToken::check(ope_00);
            this_01 = ope.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            if (bVar2) {
              tok((peg *)&rule_6,(shared_ptr<peg::Ope> *)local_af0);
              Definition::operator<=((Definition *)this_01._M_pi,(shared_ptr<peg::Ope> *)&rule_6);
              std::shared_ptr<peg::Ope>::~shared_ptr((shared_ptr<peg::Ope> *)&rule_6);
            }
            std::shared_ptr<peg::Ope>::~shared_ptr((shared_ptr<peg::Ope> *)local_af0);
            std::__detail::
            _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_false,_true>
            ::operator++(&__end3_4);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_b28,puVar1,&local_b29)
          ;
          pmVar4 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
                   ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
                                 *)pmVar4,&local_b28);
          std::__cxx11::string::~string((string *)&local_b28);
          std::allocator<char>::~allocator(&local_b29);
          local_b08 = pmVar4;
          Definition::get_core_operator((Definition *)local_b50);
          wsp((peg *)&local_b40,(shared_ptr<peg::Ope> *)local_b50);
          std::shared_ptr<peg::Ope>::operator=
                    ((shared_ptr<peg::Ope> *)(line_5.second + 200),&local_b40);
          std::shared_ptr<peg::Ope>::~shared_ptr(&local_b40);
          std::shared_ptr<peg::Ope>::~shared_ptr((shared_ptr<peg::Ope> *)local_b50);
          bVar2 = detect_infiniteLoop((ParserGenerator *)s,(Data *)&grammar,local_b08,
                                      in_stack_00000010,(char *)n);
          if (bVar2) {
            std::
            shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
            ::shared_ptr((shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
                          *)this,(nullptr_t)0x0);
            __range2._0_4_ = 1;
            goto LAB_00127b64;
          }
        }
        pmVar4 = rule;
        puVar1 = WORD_DEFINITION_NAME;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b70,puVar1,(allocator<char> *)((long)&rule_8 + 7));
        sVar15 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
                 ::count((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
                          *)pmVar4,&local_b70);
        std::__cxx11::string::~string((string *)&local_b70);
        std::allocator<char>::~allocator((allocator<char> *)((long)&rule_8 + 7));
        pmVar4 = rule;
        puVar1 = WORD_DEFINITION_NAME;
        if (sVar15 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_ba0,puVar1,&local_ba1)
          ;
          pmVar4 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
                   ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
                                 *)pmVar4,&local_ba0);
          std::__cxx11::string::~string((string *)&local_ba0);
          std::allocator<char>::~allocator(&local_ba1);
          local_b80 = (undefined1  [8])pmVar4;
          Definition::get_core_operator((Definition *)&__range2_5);
          std::shared_ptr<peg::Ope>::operator=
                    ((shared_ptr<peg::Ope> *)(line_5.second + 0xd8),
                     (shared_ptr<peg::Ope> *)&__range2_5);
          std::shared_ptr<peg::Ope>::~shared_ptr((shared_ptr<peg::Ope> *)&__range2_5);
          bVar2 = detect_infiniteLoop((ParserGenerator *)s,(Data *)&grammar,(Definition *)local_b80,
                                      in_stack_00000010,(char *)n);
          if (bVar2) {
            std::
            shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
            ::shared_ptr((shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
                          *)this,(nullptr_t)0x0);
            __range2._0_4_ = 1;
            goto LAB_00127b64;
          }
        }
        pppVar9 = &data.duplicates_of_instruction.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        __end2_5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<peg::ParserGenerator::Instruction,_std::allocator<peg::ParserGenerator::Instruction>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<peg::ParserGenerator::Instruction,_std::allocator<peg::ParserGenerator::Instruction>_>_>_>_>
                   ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<peg::ParserGenerator::Instruction,_std::allocator<peg::ParserGenerator::Instruction>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<peg::ParserGenerator::Instruction,_std::allocator<peg::ParserGenerator::Instruction>_>_>_>_>
                            *)pppVar9);
        local_bd0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<peg::ParserGenerator::Instruction,_std::allocator<peg::ParserGenerator::Instruction>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<peg::ParserGenerator::Instruction,_std::allocator<peg::ParserGenerator::Instruction>_>_>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<peg::ParserGenerator::Instruction,_std::allocator<peg::ParserGenerator::Instruction>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<peg::ParserGenerator::Instruction,_std::allocator<peg::ParserGenerator::Instruction>_>_>_>_>
                    *)pppVar9);
        while (bVar2 = std::operator!=(&__end2_5,&local_bd0), bVar2) {
          __in_00 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<peg::ParserGenerator::Instruction,_std::allocator<peg::ParserGenerator::Instruction>_>_>_>
                    ::operator*(&__end2_5);
          __k_00 = std::
                   get<0ul,std::__cxx11::string_const,std::vector<peg::ParserGenerator::Instruction,std::allocator<peg::ParserGenerator::Instruction>>>
                             (__in_00);
          this_04 = std::
                    get<1ul,std::__cxx11::string_const,std::vector<peg::ParserGenerator::Instruction,std::allocator<peg::ParserGenerator::Instruction>>>
                              (__in_00);
          pmVar4 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
                   ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>
                                 *)rule,__k_00);
          __end3_5 = std::
                     vector<peg::ParserGenerator::Instruction,_std::allocator<peg::ParserGenerator::Instruction>_>
                     ::begin(this_04);
          instruction = (Instruction *)
                        std::
                        vector<peg::ParserGenerator::Instruction,_std::allocator<peg::ParserGenerator::Instruction>_>
                        ::end(this_04);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end3_5,
                                    (__normal_iterator<const_peg::ParserGenerator::Instruction_*,_std::vector<peg::ParserGenerator::Instruction,_std::allocator<peg::ParserGenerator::Instruction>_>_>
                                     *)&instruction), bVar2) {
            info = (map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
                    *)__gnu_cxx::
                      __normal_iterator<const_peg::ParserGenerator::Instruction_*,_std::vector<peg::ParserGenerator::Instruction,_std::allocator<peg::ParserGenerator::Instruction>_>_>
                      ::operator*(&__end3_5);
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)info,"precedence");
            if (bVar2) {
              std::
              any_cast<std::map<std::basic_string_view<char,std::char_traits<char>>,std::pair<unsigned_long,char>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,char>>>>>
                        (&local_c48,
                         (any *)&(info->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right);
              local_c18 = &local_c48;
              std::
              function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function(&local_c68,in_stack_00000010);
              bVar2 = apply_precedence_instruction
                                ((ParserGenerator *)s,pmVar4,&local_c48,(char *)n,&local_c68);
              std::
              function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::~function(&local_c68);
              bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
              if (bVar2) {
                std::
                shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
                ::shared_ptr((shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
                              *)this,(nullptr_t)0x0);
              }
              __range2._0_4_ = (uint)bVar2;
              std::
              map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
              ::~map(&local_c48);
              if ((uint)__range2 != 0) goto LAB_00127b64;
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)info,"error_message");
              if (bVar2) {
                std::any_cast<std::__cxx11::string>
                          (&local_c88,
                           (any *)&(info->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right);
                std::__cxx11::string::operator=
                          ((string *)&pmVar4->error_message,(string *)&local_c88);
                std::__cxx11::string::~string((string *)&local_c88);
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)info,"no_ast_opt");
                if (bVar2) {
                  pmVar4->no_ast_opt = true;
                }
              }
            }
            __gnu_cxx::
            __normal_iterator<const_peg::ParserGenerator::Instruction_*,_std::vector<peg::ParserGenerator::Instruction,_std::allocator<peg::ParserGenerator::Instruction>_>_>
            ::operator++(&__end3_5);
          }
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<peg::ParserGenerator::Instruction,_std::allocator<peg::ParserGenerator::Instruction>_>_>_>
          ::operator++(&__end2_5);
        }
        std::__cxx11::string::operator=
                  ((string *)data._248_8_,
                   (string *)
                   &data.grammar.
                    super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        (log->super__Function_base)._M_functor._M_pod_data[0] =
             (byte)data.captures_in_current_definition._M_t._M_impl.super__Rb_tree_header.
                   _M_node_count & 1;
        std::
        shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
        ::shared_ptr((shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
                      *)this,(shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
                              *)&grammar);
        __range2._0_4_ = 1;
      }
    }
    else {
      std::
      shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
      ::shared_ptr((shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
                    *)this,(nullptr_t)0x0);
      __range2._0_4_ = 1;
    }
  }
  else {
    std::
    shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
    ::shared_ptr((shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
                  *)this,(nullptr_t)0x0);
    __range2._0_4_ = 1;
  }
LAB_00127b64:
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_688);
LAB_00127b80:
  Definition::Result::~Result((Result *)local_2b8);
  std::any::~any((any *)local_228);
  Data::~Data((Data *)&grammar);
  sVar18.
  super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar18.
  super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = &this->g;
  return (shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
          )sVar18.
           super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<Grammar> perform_core(const char *s, size_t n,
                                        const Rules &rules, std::string &start,
                                        bool &enablePackratParsing, Log log) {
    Data data;
    auto &grammar = *data.grammar;

    // Built-in macros
    {
      // `%recover`
      {
        auto &rule = grammar[RECOVER_DEFINITION_NAME];
        rule <= ref(grammar, "x", "", false, {});
        rule.name = RECOVER_DEFINITION_NAME;
        rule.s_ = "[native]";
        rule.ignoreSemanticValue = true;
        rule.is_macro = true;
        rule.params = {"x"};
      }
    }

    std::any dt = &data;
    auto r = g["Grammar"].parse(s, n, dt, nullptr, log);

    if (!r.ret) {
      if (log) {
        if (r.error_info.message_pos) {
          auto line = line_info(s, r.error_info.message_pos);
          log(line.first, line.second, r.error_info.message,
              r.error_info.label);
        } else {
          auto line = line_info(s, r.error_info.error_pos);
          log(line.first, line.second, "syntax error", r.error_info.label);
        }
      }
      return nullptr;
    }

    // User provided rules
    for (auto [user_name, user_rule] : rules) {
      auto name = user_name;
      auto ignore = false;
      if (!name.empty() && name[0] == '~') {
        ignore = true;
        name.erase(0, 1);
      }
      if (!name.empty()) {
        auto &rule = grammar[name];
        rule <= user_rule;
        rule.name = name;
        rule.ignoreSemanticValue = ignore;
      }
    }

    // Check duplicated definitions
    auto ret = true;

    if (!data.duplicates_of_definition.empty()) {
      for (const auto &[name, ptr] : data.duplicates_of_definition) {
        if (log) {
          auto line = line_info(s, ptr);
          log(line.first, line.second,
              "The definition '" + name + "' is already defined.", "");
        }
      }
      ret = false;
    }

    // Check duplicated instructions
    if (!data.duplicates_of_instruction.empty()) {
      for (const auto &[type, ptr] : data.duplicates_of_instruction) {
        if (log) {
          auto line = line_info(s, ptr);
          log(line.first, line.second,
              "The instruction '" + type + "' is already defined.", "");
        }
      }
      ret = false;
    }

    // Check undefined back references
    if (!data.undefined_back_references.empty()) {
      for (const auto &[name, ptr] : data.undefined_back_references) {
        if (log) {
          auto line = line_info(s, ptr);
          log(line.first, line.second,
              "The back reference '" + name + "' is undefined.", "");
        }
      }
      ret = false;
    }

    // Set root definition
    auto &start_rule = grammar[data.start];

    // Check if the start rule has ignore operator
    {
      if (start_rule.ignoreSemanticValue) {
        if (log) {
          auto line = line_info(s, start_rule.s_);
          log(line.first, line.second,
              "Ignore operator cannot be applied to '" + start_rule.name + "'.",
              "");
        }
        ret = false;
      }
    }

    if (!ret) { return nullptr; }

    // Check missing definitions
    auto referenced = std::unordered_set<std::string>{
        WHITESPACE_DEFINITION_NAME,
        WORD_DEFINITION_NAME,
        RECOVER_DEFINITION_NAME,
        start_rule.name,
    };

    for (auto &[_, rule] : grammar) {
      ReferenceChecker vis(grammar, rule.params);
      rule.accept(vis);
      referenced.insert(vis.referenced.begin(), vis.referenced.end());
      for (const auto &[name, ptr] : vis.error_s) {
        if (log) {
          auto line = line_info(s, ptr);
          log(line.first, line.second, vis.error_message[name], "");
        }
        ret = false;
      }
    }

    for (auto &[name, rule] : grammar) {
      if (!referenced.count(name)) {
        if (log) {
          auto line = line_info(s, rule.s_);
          auto msg = "'" + name + "' is not referenced.";
          log(line.first, line.second, msg, "");
        }
      }
    }

    if (!ret) { return nullptr; }

    // Link references
    for (auto &x : grammar) {
      auto &rule = x.second;
      LinkReferences vis(grammar, rule.params);
      rule.accept(vis);
    }

    // Check left recursion
    ret = true;

    for (auto &[name, rule] : grammar) {
      DetectLeftRecursion vis(name);
      rule.accept(vis);
      if (vis.error_s) {
        if (log) {
          auto line = line_info(s, vis.error_s);
          log(line.first, line.second, "'" + name + "' is left recursive.", "");
        }
        ret = false;
      }
    }

    if (!ret) { return nullptr; }

    // Check infinite loop
    if (detect_infiniteLoop(data, start_rule, log, s)) { return nullptr; }

    // Automatic whitespace skipping
    if (grammar.count(WHITESPACE_DEFINITION_NAME)) {
      for (auto &x : grammar) {
        auto &rule = x.second;
        auto ope = rule.get_core_operator();
        if (IsLiteralToken::check(*ope)) { rule <= tok(ope); }
      }

      auto &rule = grammar[WHITESPACE_DEFINITION_NAME];
      start_rule.whitespaceOpe = wsp(rule.get_core_operator());

      if (detect_infiniteLoop(data, rule, log, s)) { return nullptr; }
    }

    // Word expression
    if (grammar.count(WORD_DEFINITION_NAME)) {
      auto &rule = grammar[WORD_DEFINITION_NAME];
      start_rule.wordOpe = rule.get_core_operator();

      if (detect_infiniteLoop(data, rule, log, s)) { return nullptr; }
    }

    // Apply instructions
    for (const auto &[name, instructions] : data.instructions) {
      auto &rule = grammar[name];

      for (const auto &instruction : instructions) {
        if (instruction.type == "precedence") {
          const auto &info =
              std::any_cast<PrecedenceClimbing::BinOpeInfo>(instruction.data);

          if (!apply_precedence_instruction(rule, info, s, log)) {
            return nullptr;
          }
        } else if (instruction.type == "error_message") {
          rule.error_message = std::any_cast<std::string>(instruction.data);
        } else if (instruction.type == "no_ast_opt") {
          rule.no_ast_opt = true;
        }
      }
    }

    // Set root definition
    start = data.start;
    enablePackratParsing = data.enablePackratParsing;

    return data.grammar;
  }